

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-ben.cpp
# Opt level: O0

int check_pointer(Pointer *ptr,char *name)

{
  bool bVar1;
  undefined8 in_RSI;
  Pointer *in_RDI;
  bool in_stack_0000003f;
  PSNode *in_stack_00000040;
  int local_4;
  
  printf("target %s=",in_RSI);
  printName(in_stack_00000040,in_stack_0000003f);
  bVar1 = dg::pta::Pointer::isUnknown(in_RDI);
  if (bVar1) {
    printf("Unknown Ptr\n");
    local_4 = 2;
  }
  else {
    bVar1 = dg::pta::Pointer::isNull(in_RDI);
    if (bVar1) {
      printf("Null Ptr\n");
      local_4 = 2;
    }
    else {
      printf("\n");
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int check_pointer(const Pointer &ptr, const char *name) {
    printf("target %s=", name);
    printName(ptr.target, false);
    if (ptr.isUnknown()) {
        printf("Unknown Ptr\n");
        return MayAlias;
    }
    if (ptr.isNull()) {
        printf("Null Ptr\n");
        return MayAlias;
    }
    printf("\n");
    return NoAlias;
}